

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O3

void __thiscall kratos::ActiveVisitor::visit(ActiveVisitor *this,SequentialStmtBlock *stmt)

{
  unordered_map<kratos::Port_*,_bool,_std::hash<kratos::Port_*>,_std::equal_to<kratos::Port_*>,_std::allocator<std::pair<kratos::Port_*const,_bool>_>_>
  *this_00;
  EventEdgeType EVar1;
  pointer pEVar2;
  iterator iVar3;
  VarException *pVVar4;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  pointer pEVar5;
  bool bVar6;
  pair<std::__detail::_Node_iterator<std::pair<kratos::Port_*const,_bool>,_false,_false>,_bool>
  pVar7;
  initializer_list<const_kratos::IRNode_*> __l;
  initializer_list<const_kratos::IRNode_*> __l_00;
  initializer_list<const_kratos::IRNode_*> __l_01;
  string_view format_str;
  string_view format_str_00;
  string_view format_str_01;
  format_args args;
  format_args args_00;
  format_args args_01;
  Port *local_e8;
  SequentialStmtBlock *local_e0;
  Stmt *local_d8;
  undefined1 local_d0 [8];
  shared_ptr<kratos::Port> port_s;
  undefined1 local_b8 [8];
  SequentialStmtBlock *pSStack_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  string local_88;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_68;
  undefined1 local_48 [16];
  element_type *port;
  
  pEVar5 = (stmt->conditions_).
           super__Vector_base<kratos::EventControl,_std::allocator<kratos::EventControl>_>._M_impl.
           super__Vector_impl_data._M_start;
  pEVar2 = (stmt->conditions_).
           super__Vector_base<kratos::EventControl,_std::allocator<kratos::EventControl>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pEVar5 != pEVar2) {
    this_00 = &this->reset_map_;
    port_s.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
    local_48._0_8_ = stmt;
    do {
      if (pEVar5->var->type_ == PortIO) {
        EVar1 = pEVar5->edge;
        Var::as<kratos::Port>((Var *)local_d0);
        local_48._8_8_ = local_d0;
        if (*(PortType *)((long)local_d0 + 0x274) == AsyncReset) {
          bVar6 = EVar1 == Posedge;
          if (((*(uint *)((long)local_d0 + 0x278) >> 8 & 1) != 0) &&
             (bVar6 != (bool)(char)*(uint *)((long)local_d0 + 0x278))) {
            pVVar4 = (VarException *)__cxa_allocate_exception(0x10);
            (**(code **)(*(long *)local_48._8_8_ + 0xf8))(&local_68);
            local_98._M_allocated_capacity = (size_type)"low";
            local_a8._M_allocated_capacity = (size_type)"high";
            if (EVar1 == Posedge) {
              local_a8._M_allocated_capacity = (size_type)"low";
              local_98._M_allocated_capacity = (size_type)"high";
            }
            local_b8 = (undefined1  [8])
                       local_68.
                       super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            pSStack_b0 = (SequentialStmtBlock *)
                         local_68.
                         super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
            format_str_00.size_ = 0xccd;
            format_str_00.data_ = (char *)0x32;
            args_00.
            super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
            .field_1.args_ = in_R9.args_;
            args_00.
            super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
            .desc_ = (unsigned_long_long)local_b8;
            fmt::v7::detail::vformat_abi_cxx11_
                      (&local_88,(detail *)"{0} is declared reset {1} but is used as reset {2}",
                       format_str_00,args_00);
            local_e8 = (Port *)local_48._8_8_;
            local_e0 = (SequentialStmtBlock *)local_48._0_8_;
            __l_00._M_len = 2;
            __l_00._M_array = (iterator)&local_e8;
            std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                      ((vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)
                       local_b8,__l_00,(allocator_type *)((long)&port + 7));
            VarException::VarException
                      (pVVar4,&local_88,
                       (vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)
                       local_b8);
            __cxa_throw(pVVar4,&VarException::typeinfo,std::runtime_error::~runtime_error);
          }
          iVar3 = std::
                  _Hashtable<kratos::Port_*,_std::pair<kratos::Port_*const,_bool>,_std::allocator<std::pair<kratos::Port_*const,_bool>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Port_*>,_std::hash<kratos::Port_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::find(&this_00->_M_h,(key_type *)(local_48 + 8));
          if (iVar3.super__Node_iterator_base<std::pair<kratos::Port_*const,_bool>,_false>._M_cur ==
              (__node_type *)0x0) {
            local_b8 = (undefined1  [8])local_48._8_8_;
            pSStack_b0 = (SequentialStmtBlock *)CONCAT71(pSStack_b0._1_7_,bVar6);
            pVar7 = std::
                    _Hashtable<kratos::Port*,std::pair<kratos::Port*const,bool>,std::allocator<std::pair<kratos::Port*const,bool>>,std::__detail::_Select1st,std::equal_to<kratos::Port*>,std::hash<kratos::Port*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                    ::_M_emplace<std::pair<kratos::Port*,bool>>
                              ((_Hashtable<kratos::Port*,std::pair<kratos::Port*const,bool>,std::allocator<std::pair<kratos::Port*const,bool>>,std::__detail::_Select1st,std::equal_to<kratos::Port*>,std::hash<kratos::Port*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                                *)this_00,local_b8);
            local_b8 = (undefined1  [8])local_48._8_8_;
            pSStack_b0 = (SequentialStmtBlock *)local_48._0_8_;
            std::
            _Hashtable<kratos::Port*,std::pair<kratos::Port*const,bool>,std::allocator<std::pair<kratos::Port*const,bool>>,std::__detail::_Select1st,std::equal_to<kratos::Port*>,std::hash<kratos::Port*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
            ::_M_emplace<std::pair<kratos::Port*,kratos::SequentialStmtBlock*>>
                      ((_Hashtable<kratos::Port*,std::pair<kratos::Port*const,bool>,std::allocator<std::pair<kratos::Port*const,bool>>,std::__detail::_Select1st,std::equal_to<kratos::Port*>,std::hash<kratos::Port*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                        *)this_00,local_b8,pVar7._8_8_);
          }
          else {
            iVar3 = std::
                    _Hashtable<kratos::Port_*,_std::pair<kratos::Port_*const,_bool>,_std::allocator<std::pair<kratos::Port_*const,_bool>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Port_*>,_std::hash<kratos::Port_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    ::find(&this_00->_M_h,(key_type *)(local_48 + 8));
            if (iVar3.super__Node_iterator_base<std::pair<kratos::Port_*const,_bool>,_false>._M_cur
                == (__node_type *)0x0) {
              std::__throw_out_of_range("_Map_base::at");
            }
            if ((bool)*(char *)((long)iVar3.
                                      super__Node_iterator_base<std::pair<kratos::Port_*const,_bool>,_false>
                                      ._M_cur + 0x10) != bVar6) {
              pVVar4 = (VarException *)__cxa_allocate_exception(0x10);
              (**(code **)(*(long *)local_48._8_8_ + 0xf8))(&local_88);
              local_68.
              super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)local_88._M_dataplus._M_p;
              local_68.
              super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)local_88._M_string_length;
              format_str_01.size_ = 0xd;
              format_str_01.data_ = (char *)0x2a;
              args_01.
              super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
              .field_1.args_ = in_R9.args_;
              args_01.
              super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
              .desc_ = (unsigned_long_long)&local_68;
              fmt::v7::detail::vformat_abi_cxx11_
                        ((string *)local_b8,(detail *)"Inconsistent active low/high usage for {0}",
                         format_str_01,args_01);
              local_e8 = (Port *)local_48._8_8_;
              local_e0 = (SequentialStmtBlock *)local_48._0_8_;
              local_d8 = get_reset_stmt((ActiveVisitor *)
                                        port_s.
                                        super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount._M_pi,(Port *)local_48._8_8_);
              __l_01._M_len = 3;
              __l_01._M_array = (iterator)&local_e8;
              std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                        (&local_68,__l_01,(allocator_type *)((long)&port + 7));
              VarException::VarException(pVVar4,(string *)local_b8,&local_68);
              __cxa_throw(pVVar4,&VarException::typeinfo,std::runtime_error::~runtime_error);
            }
          }
        }
        else if (*(PortType *)((long)local_d0 + 0x274) == Reset) {
          pVVar4 = (VarException *)__cxa_allocate_exception(0x10);
          (**(code **)(*(long *)local_48._8_8_ + 0xf8))(&local_88);
          local_68.
          super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)local_88._M_dataplus._M_p;
          local_68.
          super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)local_88._M_string_length;
          format_str.size_ = 0xd;
          format_str.data_ = (char *)0x36;
          args.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .field_1.values_ = in_R9.values_;
          args.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .desc_ = (unsigned_long_long)&local_68;
          fmt::v7::detail::vformat_abi_cxx11_
                    ((string *)local_b8,
                     (detail *)"{0} is used as async reset but is declared synchronous",format_str,
                     args);
          local_e8 = (Port *)local_48._8_8_;
          local_e0 = (SequentialStmtBlock *)local_48._0_8_;
          __l._M_len = 2;
          __l._M_array = (iterator)&local_e8;
          std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                    (&local_68,__l,(allocator_type *)((long)&port + 7));
          VarException::VarException(pVVar4,(string *)local_b8,&local_68);
          __cxa_throw(pVVar4,&VarException::typeinfo,std::runtime_error::~runtime_error);
        }
        if (port_s.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     port_s.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        }
      }
      pEVar5 = pEVar5 + 1;
    } while (pEVar5 != pEVar2);
  }
  return;
}

Assistant:

void visit(SequentialStmtBlock* stmt) override {
        auto const& sensitivity = stmt->get_event_controls();
        for (auto const& event : sensitivity) {
            auto t = event.edge;
            auto* v = event.var;
            if (v->type() == VarType::PortIO) {
                auto port_s = v->as<Port>();
                auto* port = port_s.get();
                if (port->port_type() == PortType::AsyncReset) {
                    auto reset_high = t == EventEdgeType::Posedge;
                    // check if we have reset edge set
                    if (port->active_high()) {
                        if (reset_high != (*port->active_high())) {
                            throw VarException(
                                ::format("{0} is declared reset {1} but is used as reset {2}",
                                         port->to_string(), reset_high ? "low" : "high",
                                         reset_high ? "high" : "low"),
                                {port, stmt});
                        }
                    }
                    if (reset_map_.find(port) != reset_map_.end()) {
                        // check consistency
                        if (reset_map_.at(port) != reset_high) {
                            throw VarException(
                                ::format("Inconsistent active low/high usage for {0}",
                                         port->to_string()),
                                {port, stmt, get_reset_stmt(port)});
                        }
                    } else {
                        reset_map_.emplace(std::make_pair(port, reset_high));
                        reset_map_.emplace(std::make_pair(port, stmt));
                    }
                } else if (port->port_type() == PortType::Reset) {
                    throw VarException(
                        ::format("{0} is used as async reset but is declared synchronous",
                                 port->to_string()),
                        {port, stmt});
                }
            }
        }
    }